

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall Token::Token(Token *this,TokenType type)

{
  TokenType type_local;
  Token *this_local;
  
  this->mType = type;
  NumericConstant::NumericConstant(&this->mNumericValue);
  this->mCharValue = '\0';
  this->mCharValue2 = '\0';
  std::__cxx11::string::string((string *)&this->mIdentifier);
  return;
}

Assistant:

Token::Token(TokenType type)
	: mType(type),
	  mNumericValue(),
	  mCharValue(0),
	  mCharValue2(0) {

}